

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

int hostkey_method_ssh_dss_initPEMFromMemory
              (LIBSSH2_SESSION *session,char *privkeyfiledata,size_t privkeyfiledata_len,
              uchar *passphrase,void **abstract)

{
  int iVar1;
  int iVar2;
  EVP_PKEY *dsactx;
  EVP_PKEY *local_30;
  
  if ((EVP_PKEY *)*abstract != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)*abstract);
    *abstract = (void *)0x0;
  }
  iVar1 = _libssh2_dsa_new_private_frommemory
                    (&local_30,session,privkeyfiledata,privkeyfiledata_len,passphrase);
  iVar2 = -1;
  if (iVar1 == 0) {
    *abstract = local_30;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_dss_initPEMFromMemory(LIBSSH2_SESSION * session,
                                         const char *privkeyfiledata,
                                         size_t privkeyfiledata_len,
                                         unsigned const char *passphrase,
                                         void **abstract)
{
    libssh2_dsa_ctx *dsactx;
    int ret;

    if(*abstract) {
        hostkey_method_ssh_dss_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_dsa_new_private_frommemory(&dsactx, session,
                                              privkeyfiledata,
                                              privkeyfiledata_len, passphrase);
    if(ret) {
        return -1;
    }

    *abstract = dsactx;

    return 0;
}